

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O3

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::prepare
          (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *this)

{
  FuncNode *pFVar1;
  BaseRAPass *pBVar2;
  uint uVar3;
  Error EVar4;
  RABlock *pRVar5;
  BaseNode *node;
  
  pFVar1 = this->_pass->_func;
  node = (BaseNode *)0x0;
  this->_funcNode = pFVar1;
  pRVar5 = BaseRAPass::newBlockOrExistingAt(this->_pass,pFVar1->_exitNode,&node);
  this->_retBlock = pRVar5;
  EVar4 = 1;
  if (pRVar5 != (RABlock *)0x0) {
    pBVar2 = this->_pass;
    *(uint *)(pRVar5 + 0xc) = *(uint *)(pRVar5 + 0xc) | 0x14;
    uVar3 = *(uint *)&pBVar2->field_0xc8;
    if (uVar3 == *(uint *)&pBVar2->field_0xcc) {
      EVar4 = ZoneVectorBase::_grow((ZoneVectorBase *)&pBVar2->_exits,&pBVar2->_allocator,8,1);
      if (EVar4 != 0) {
        return EVar4;
      }
      uVar3 = *(uint *)&pBVar2->field_0xc8;
    }
    *(RABlock **)(*(long *)&pBVar2->_exits + (ulong)uVar3 * 8) = pRVar5;
    *(int *)&pBVar2->field_0xc8 = *(int *)&pBVar2->field_0xc8 + 1;
    if ((FuncNode *)node == pFVar1) {
      pRVar5 = this->_retBlock;
      this->_curBlock = pRVar5;
    }
    else {
      pRVar5 = BaseRAPass::newBlock(this->_pass,(BaseNode *)0x0);
      this->_curBlock = pRVar5;
      if (pRVar5 == (RABlock *)0x0) {
        return 1;
      }
    }
    (this->_blockRegStats)._packed = 0;
    this->_exitLabelId = *(uint32_t *)(pFVar1->_exitNode + 0x30);
    this->_hasCode = false;
    EVar4 = BaseRAPass::addBlock(this->_pass,pRVar5);
  }
  return EVar4;
}

Assistant:

Error prepare() noexcept {
    FuncNode* func = _pass->func();
    BaseNode* node = nullptr;

    // Create entry and exit blocks.
    _funcNode = func;
    _retBlock = _pass->newBlockOrExistingAt(func->exitNode(), &node);

    if (ASMJIT_UNLIKELY(!_retBlock))
      return DebugUtils::errored(kErrorOutOfMemory);

    _retBlock->makeTargetable();
    ASMJIT_PROPAGATE(_pass->addExitBlock(_retBlock));

    if (node != func) {
      _curBlock = _pass->newBlock();
      if (ASMJIT_UNLIKELY(!_curBlock))
        return DebugUtils::errored(kErrorOutOfMemory);
    }
    else {
      // Function that has no code at all.
      _curBlock = _retBlock;
    }

    // Reset everything we may need.
    _blockRegStats.reset();
    _exitLabelId = func->exitNode()->labelId();

    // Initially we assume there is no code in the function body.
    _hasCode = false;

    return _pass->addBlock(_curBlock);
  }